

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMemory.c
# Opt level: O0

Extra_MmStep_t * Extra_MmStepStart(int nSteps)

{
  Extra_MmStep_t *__s;
  Extra_MmFixed_t **ppEVar1;
  Extra_MmFixed_t *pEVar2;
  int local_20;
  int local_1c;
  int k;
  int i;
  Extra_MmStep_t *p;
  int nSteps_local;
  
  __s = (Extra_MmStep_t *)malloc(0x30);
  memset(__s,0,0x30);
  __s->nMems = nSteps;
  ppEVar1 = (Extra_MmFixed_t **)malloc((long)__s->nMems << 3);
  __s->pMems = ppEVar1;
  for (local_1c = 0; local_1c < __s->nMems; local_1c = local_1c + 1) {
    pEVar2 = Extra_MmFixedStart(8 << ((byte)local_1c & 0x1f));
    __s->pMems[local_1c] = pEVar2;
  }
  __s->nMapSize = 4 << ((byte)__s->nMems & 0x1f);
  ppEVar1 = (Extra_MmFixed_t **)malloc((long)(__s->nMapSize + 1) << 3);
  __s->pMap = ppEVar1;
  *__s->pMap = (Extra_MmFixed_t *)0x0;
  for (local_20 = 1; local_20 < 5; local_20 = local_20 + 1) {
    __s->pMap[local_20] = *__s->pMems;
  }
  for (local_1c = 0; local_1c < __s->nMems; local_1c = local_1c + 1) {
    local_20 = 4 << ((byte)local_1c & 0x1f);
    while (local_20 = local_20 + 1, local_20 <= 8 << ((byte)local_1c & 0x1f)) {
      __s->pMap[local_20] = __s->pMems[local_1c];
    }
  }
  return __s;
}

Assistant:

Extra_MmStep_t * Extra_MmStepStart( int nSteps )
{
    Extra_MmStep_t * p;
    int i, k;
    p = ABC_ALLOC( Extra_MmStep_t, 1 );
    memset( p, 0, sizeof(Extra_MmStep_t) );
    p->nMems = nSteps;
    // start the fixed memory managers
    p->pMems = ABC_ALLOC( Extra_MmFixed_t *, p->nMems );
    for ( i = 0; i < p->nMems; i++ )
        p->pMems[i] = Extra_MmFixedStart( (8<<i) );
    // set up the mapping of the required memory size into the corresponding manager
    p->nMapSize = (4<<p->nMems);
    p->pMap = ABC_ALLOC( Extra_MmFixed_t *, p->nMapSize+1 );
    p->pMap[0] = NULL;
    for ( k = 1; k <= 4; k++ )
        p->pMap[k] = p->pMems[0];
    for ( i = 0; i < p->nMems; i++ )
        for ( k = (4<<i)+1; k <= (8<<i); k++ )
            p->pMap[k] = p->pMems[i];
//for ( i = 1; i < 100; i ++ )
//printf( "%10d: size = %10d\n", i, p->pMap[i]->nEntrySize );
    return p;
}